

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O1

void __thiscall QEvdevTabletHandler::readData(QEvdevTabletHandler *this)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  undefined8 uVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  input_event *ev;
  uint uVar8;
  long in_FS_OFFSET;
  input_event buffer [32];
  char local_358 [24];
  char *local_340;
  input_event local_338 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ev = local_338;
  memset(ev,0xaa,0x300);
  uVar8 = 0;
  do {
    iVar7 = this->m_fd;
    do {
      sVar2 = read(iVar7,(void *)((long)&local_338[0].time.tv_sec + (ulong)uVar8),
                   0x300 - (ulong)uVar8);
      if (sVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    iVar7 = (int)sVar2;
    if (iVar7 == 0) {
      local_358[0] = '\x02';
      local_358[1] = '\0';
      local_358[2] = '\0';
      local_358[3] = '\0';
      local_358[4] = '\0';
      local_358[5] = '\0';
      local_358[6] = '\0';
      local_358[7] = '\0';
      local_358[8] = '\0';
      local_358[9] = '\0';
      local_358[10] = '\0';
      local_358[0xb] = '\0';
      local_358[0xc] = '\0';
      local_358[0xd] = '\0';
      local_358[0xe] = '\0';
      local_358[0xf] = '\0';
      local_358[0x10] = '\0';
      local_358[0x11] = '\0';
      local_358[0x12] = '\0';
      local_358[0x13] = '\0';
      local_358[0x14] = '\0';
      local_358[0x15] = '\0';
      local_358[0x16] = '\0';
      local_358[0x17] = '\0';
      local_340 = "default";
      uVar4 = QString::utf16();
      QMessageLogger::warning(local_358,"evdevtablet: %ls: Got EOF from input device",uVar4);
LAB_0010880f:
      cVar6 = '\x01';
    }
    else if (iVar7 < 0) {
      piVar3 = __errno_location();
      cVar6 = '\0';
      if ((*piVar3 != 4) && (*piVar3 != 0xb)) {
        uVar4 = QString::utf16();
        qErrnoWarning("evdevtablet: %ls: Could not read from input device",uVar4);
        cVar6 = '\x01';
        if (*piVar3 == 0x13) {
          if (this->m_notifier != (QSocketNotifier *)0x0) {
            (**(code **)(*(long *)this->m_notifier + 0x20))();
          }
          this->m_notifier = (QSocketNotifier *)0x0;
          iVar7 = this->m_fd;
          do {
            iVar1 = close(iVar7);
            if (iVar1 != -1) break;
          } while (*piVar3 == 4);
          this->m_fd = -1;
          goto LAB_0010880f;
        }
      }
    }
    else {
      uVar8 = uVar8 + iVar7;
      cVar6 = ((uVar8 * -0x55555555 >> 3 | uVar8 * 0x60000000) < 0xaaaaaab) * '\x02';
    }
    if (cVar6 != '\0') {
      if ((cVar6 == '\x02') && (0x17 < uVar8)) {
        uVar5 = (ulong)uVar8 / 0x18;
        do {
          QEvdevTabletData::processInputEvent(this->d,ev);
          ev = ev + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void QEvdevTabletHandler::readData()
{
    input_event buffer[32];
    int n = 0;
    for (; ;) {
        int result = QT_READ(m_fd, reinterpret_cast<char*>(buffer) + n, sizeof(buffer) - n);
        if (!result) {
            qWarning("evdevtablet: %ls: Got EOF from input device", qUtf16Printable(m_device));
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning("evdevtablet: %ls: Could not read from input device", qUtf16Printable(m_device));
                if (errno == ENODEV) { // device got disconnected -> stop reading
                    delete m_notifier;
                    m_notifier = 0;
                    QT_CLOSE(m_fd);
                    m_fd = -1;
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(input_event) == 0)
                break;
        }
    }

    n /= sizeof(input_event);

    for (int i = 0; i < n; ++i)
        d->processInputEvent(&buffer[i]);
}